

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O2

void re_print(regex_t *pattern)

{
  uchar uVar1;
  regex_t *prVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = 0;
  while( true ) {
    if (lVar4 == 0x1e) {
      return;
    }
    if ((ulong)pattern[lVar4].type == 0) break;
    prVar2 = pattern + lVar4;
    printf("type: %s",&DAT_00118cf0 + *(int *)(&DAT_00118cf0 + (ulong)pattern[lVar4].type * 4));
    if (prVar2->type - 8 < 2) {
      printf(" [");
      for (lVar3 = 0;
          ((lVar3 != 0x28 && (uVar1 = (prVar2->field_1).ccl[lVar3], uVar1 != '\0')) &&
          (uVar1 != ']')); lVar3 = lVar3 + 1) {
        putchar((int)(char)uVar1);
      }
      putchar(0x5d);
    }
    else if (prVar2->type == 7) {
      printf(" \'%c\'",(ulong)(prVar2->field_1).ch);
    }
    putchar(10);
    lVar4 = lVar4 + 1;
  }
  return;
}

Assistant:

void re_print(regex_t* pattern)
{
  const char* types[] = { "UNUSED", "DOT", "BEGIN", "END", "QUESTIONMARK", "STAR", "PLUS", "CHAR", "CHAR_CLASS", "INV_CHAR_CLASS", "DIGIT", "NOT_DIGIT", "ALPHA", "NOT_ALPHA", "WHITESPACE", "NOT_WHITESPACE", "BRANCH" };

  int i;
  for (i = 0; i < MAX_REGEXP_OBJECTS; ++i)
  {
    if (pattern[i].type == UNUSED)
    {
      break;
    }

    printf("type: %s", types[pattern[i].type]);
    if (pattern[i].type == CHAR_CLASS || pattern[i].type == INV_CHAR_CLASS)
    {
      printf(" [");
      int j;
      char c;
      for (j = 0; j < MAX_CHAR_CLASS_LEN; ++j)
      {
        c = pattern[i].ccl[j];
        if ((c == '\0') || (c == ']'))
        {
          break;
        }
        printf("%c", c);
      }
      printf("]");
    }
    else if (pattern[i].type == CHAR)
    {
      printf(" '%c'", pattern[i].ch);
    }
    printf("\n");
  }
}